

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O1

void duckdb::STDDevBaseOperation::Combine<duckdb::StddevState,duckdb::RegrSYYOperation>
               (StddevState *source,StddevState *target,AggregateInputData *param_3)

{
  uint64_t uVar1;
  double dVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar3 = target->count;
  if (uVar3 != 0) {
    uVar4 = source->count;
    if (uVar4 != 0) {
      uVar1 = uVar4 + uVar3;
      auVar7._8_4_ = (int)(uVar3 >> 0x20);
      auVar7._0_8_ = uVar3;
      auVar7._12_4_ = 0x45300000;
      dVar5 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
      auVar10._8_4_ = (int)(uVar4 >> 0x20);
      auVar10._0_8_ = uVar4;
      auVar10._12_4_ = 0x45300000;
      dVar6 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      auVar11._8_4_ = (int)(uVar1 >> 0x20);
      auVar11._0_8_ = uVar1;
      auVar11._12_4_ = 0x45300000;
      dVar8 = (auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      dVar2 = source->mean;
      dVar9 = dVar2 - target->mean;
      target->dsquared =
           (dVar9 * dVar9 * dVar6 * dVar5) / dVar8 + source->dsquared + target->dsquared;
      target->mean = (dVar6 * dVar2 + target->mean * dVar5) / dVar8;
      target->count = uVar1;
    }
    return;
  }
  target->dsquared = source->dsquared;
  dVar2 = source->mean;
  target->count = source->count;
  target->mean = dVar2;
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (target.count == 0) {
			target = source;
		} else if (source.count > 0) {
			const auto count = target.count + source.count;
			D_ASSERT(count >= target.count); // This is a check that we are not overflowing
			const double target_count = static_cast<double>(target.count);
			const double source_count = static_cast<double>(source.count);
			const double total_count = static_cast<double>(count);
			const auto mean = (source_count * source.mean + target_count * target.mean) / total_count;
			const auto delta = source.mean - target.mean;
			target.dsquared =
			    source.dsquared + target.dsquared + delta * delta * source_count * target_count / total_count;
			target.mean = mean;
			target.count = count;
		}
	}